

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::calcBall(Map *this,int n)

{
  float fVar1;
  int x;
  int y;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  int py;
  int px;
  int by;
  int bx;
  float palx_1;
  float palx;
  int i;
  float dy;
  float dx;
  int n_local;
  Map *this_local;
  
  if (((-1 < n) && (n < 0x1e)) && (this->ball[n] != (Ball *)0x0)) {
    dVar5 = cos((double)this->ball[n]->angle * 3.14);
    fVar2 = (float)(dVar5 * (double)this->ball[n]->speed);
    dVar5 = sin((double)this->ball[n]->angle * 3.14);
    fVar3 = (float)(dVar5 * (double)this->ball[n]->speed);
    this->ball[n]->x = fVar2 + this->ball[n]->x;
    this->ball[n]->y = fVar3 + this->ball[n]->y;
    if ((this->ball[n]->x <= 0.0) || ((float)this->fieldWidth <= this->ball[n]->x)) {
      fVar4 = shiftAngleV(this->ball[n]->angle);
      this->ball[n]->angle = fVar4;
      this->ball[n]->x = this->ball[n]->x - fVar2;
      this->ball[n]->speed = this->ball[n]->speed + 0.01;
    }
    else if (this->ball[n]->y <= 0.0) {
      fVar4 = shiftAngleH(this->ball[n]->angle);
      this->ball[n]->angle = fVar4;
      this->ball[n]->y = this->ball[n]->y - fVar3;
      this->ball[n]->speed = this->ball[n]->speed + 0.01;
    }
    if ((((float)this->fieldBreakpoint <= this->ball[n]->y) &&
        (this->ball[n]->y <= (float)(this->fieldBreakpoint + this->palette->h))) &&
       (((float)this->palette->pos <= this->ball[n]->x &&
        (this->ball[n]->x <= (float)(this->palette->pos + this->palette->w))))) {
      if ((this->stickyPalette & 1U) == 0) {
        this->ball[n]->y = (float)(this->fieldBreakpoint + -8);
        this->ball[n]->angle =
             ((this->ball[n]->x - (float)this->palette->pos) / (float)this->palette->w) * 0.7 + -0.9
        ;
      }
      else {
        for (palx_1 = 0.0; (int)palx_1 < 0x1e; palx_1 = (float)((int)palx_1 + 1)) {
          if (this->palette->dockedBalls[(int)palx_1] == (Ball *)0x0) {
            this->ball[n]->angle =
                 ((this->ball[n]->x - (float)this->palette->pos) / (float)this->palette->w) * 0.7 +
                 -0.9;
            this->ball[n]->y = 392.0;
            this->ball[n]->speed = 0.0;
            this->palette->dockedBalls[(int)palx_1] = this->ball[n];
            break;
          }
        }
      }
    }
    x = (int)(this->ball[n]->x / 24.0);
    y = (int)(this->ball[n]->y / 16.0);
    fVar4 = this->ball[n]->x;
    fVar1 = this->ball[n]->y;
    if ((((-1 < x) && (x < 0x18)) && (-1 < y)) && ((y < 0x10 && (this->block[x][y]->type != 'O'))))
    {
      if (this->block[x][y]->type != '\x18') {
        deleteBlock(this,x,y);
      }
      if (x == (int)((fVar4 - fVar2) / 24.0)) {
        fVar4 = shiftAngleH(this->ball[n]->angle);
        this->ball[n]->angle = fVar4;
        this->ball[n]->x = this->ball[n]->x - fVar2;
        if (this->ball[n]->speed < 1.2) {
          this->ball[n]->speed = this->ball[n]->speed + 0.01;
        }
      }
      if (y == (int)((fVar1 - fVar3) / 16.0)) {
        fVar2 = shiftAngleV(this->ball[n]->angle);
        this->ball[n]->angle = fVar2;
        this->ball[n]->y = this->ball[n]->y - fVar3;
        if (this->ball[n]->speed < 1.2) {
          this->ball[n]->speed = this->ball[n]->speed + 0.01;
        }
      }
    }
    if ((float)this->fieldHeight < this->ball[n]->y) {
      removeBall(this,n);
    }
  }
  if (this->balls < 1) {
    this->lose = true;
    this->lives = this->lives + -1;
  }
  else if (this->blockAmount < 1) {
    this->lose = true;
  }
  return;
}

Assistant:

void Map::calcBall(int n){
    if(n>=0 && n<MAX_BALLS && ball[n]){
        float dx = cos(ball[n]->angle*PI)*ball[n]->speed;
        float dy = sin(ball[n]->angle*PI)*ball[n]->speed;
        ball[n]->x += dx;
        ball[n]->y += dy;
        // Border collision
            if(ball[n]->x<=0 || ball[n]->x>=fieldWidth){
                ball[n]->angle = shiftAngleV(ball[n]->angle);
                ball[n]->x -= dx;
                if(ACCELERATE_ON_BOUNCE)
                    ball[n]->speed += ACCELERATE_ON_BOUNCE;
            } else if(ball[n]->y<=0){
                ball[n]->angle = shiftAngleH(ball[n]->angle);
                ball[n]->y -= dy;
                if(ACCELERATE_ON_BOUNCE)
                    ball[n]->speed += ACCELERATE_ON_BOUNCE;
            }
        // Palette collision
            if(ball[n]->y >= fieldBreakpoint && ball[n]->y <= fieldBreakpoint + palette->h
                    && ball[n]->x >= palette->pos && ball[n]->x <= palette->pos + palette->w){
                if(stickyPalette){
                    for(int i=0; i<MAX_BALLS; i++){
                        if(!palette->dockedBalls[i]){
                            float palx = ball[n]->x - palette->pos;
                            ball[n]->angle = -0.9 + (palx / palette->w) * 0.7;
                            ball[n]->y = PALETTE_ROW*BLOCK_H - BALL_H;
                            ball[n]->speed = 0;
                            palette->dockedBalls[i] = ball[n];
                            break;
                        }
                    }

                } else{
                    ball[n]->y = fieldBreakpoint - BALL_H;
                    float palx = ball[n]->x - palette->pos;
                    ball[n]->angle = -0.9 + (palx / palette->w) * 0.7;
                }
            }
        // Nearby block collision
            int bx = ball[n]->x / BLOCK_W;
            int by = ball[n]->y / BLOCK_H;
            int px = (ball[n]->x-dx) / BLOCK_W;
            int py = (ball[n]->y-dy) / BLOCK_H;
            if(bx >= 0 && bx < BLOCKS_W && by >= 0 && by < BLOCKS_H) {
                if(block[bx][by]->type != EMPTY_BLOCK_ID){
                    if(block[bx][by]->type != BLOCK_BLOCKY_ID) deleteBlock(bx, by);
                    if(bx == px){
                        ball[n]->angle = shiftAngleH(ball[n]->angle);
                        ball[n]->x -= dx;
                        if(ACCELERATE_ON_BOUNCE && ball[n]->speed < BALL_MAX_SPEED)
                            ball[n]->speed += ACCELERATE_ON_BOUNCE;
                    }
                    if(by == py){
                        ball[n]->angle = shiftAngleV(ball[n]->angle);
                        ball[n]->y -= dy;
                        if(ACCELERATE_ON_BOUNCE && ball[n]->speed < BALL_MAX_SPEED)
                            ball[n]->speed += ACCELERATE_ON_BOUNCE;
                    }

                }

            }

        // Fly through breakpoint
            if(ball[n]->y > fieldHeight){
                //ball[n]->angle = shiftAngleH(ball[n]->angle);
                removeBall(n);
            }
    }
    if(balls<=0) {
        lose = true;
        lives--;
    } else if(blockAmount <= 0){
        lose = true;
    }
}